

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugin_ConvolutionReverb.cpp
# Opt level: O3

void ConvolutionReverb::SetupImpulse(EffectData *data,int numchannels,int blocksize,int samplerate)

{
  int iVar1;
  int iVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined1 auVar8 [16];
  uint uVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  UnityComplexNumber *pUVar13;
  Channel *pCVar14;
  float *pfVar15;
  long lVar16;
  UnityComplexNumber **ppUVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  long lVar21;
  ulong uVar22;
  long lVar23;
  ulong uVar24;
  size_t sVar25;
  ulong uVar26;
  uint uVar27;
  size_t sVar28;
  long lVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  double dVar35;
  undefined1 auVar36 [16];
  float fVar38;
  double dVar39;
  undefined1 auVar40 [16];
  double dVar41;
  undefined1 auVar42 [16];
  float fVar43;
  undefined1 auVar44 [16];
  float fVar45;
  MutexScopeLock mutexScope2;
  MutexScopeLock mutexScope1;
  uint local_d8;
  MutexScopeLock local_98;
  MutexScopeLock local_90;
  long local_88;
  double local_80;
  ulong local_78;
  long local_70;
  EffectData *local_68;
  ulong local_60;
  long local_58;
  float *local_50;
  undefined1 local_48 [16];
  long lVar37;
  
  local_90.mutex = data->mutex;
  Mutex::Lock(local_90.mutex);
  uVar9 = (uint)data->p[9];
  if (((data->numchannels == numchannels) && (data->hopsize == blocksize)) &&
     (data->samplerate == samplerate)) {
    if ((data->lastparams[2] == data->p[2]) && (!NAN(data->lastparams[2]) && !NAN(data->p[2]))) {
      if ((data->lastparams[3] == data->p[3]) && (!NAN(data->lastparams[3]) && !NAN(data->p[3]))) {
        if ((data->lastparams[4] == data->p[4]) && (!NAN(data->lastparams[4]) && !NAN(data->p[4])))
        {
          if ((data->lastparams[5] == data->p[5]) && (!NAN(data->lastparams[5]) && !NAN(data->p[5]))
             ) {
            if ((data->lastparams[6] == data->p[6]) &&
               (!NAN(data->lastparams[6]) && !NAN(data->p[6]))) {
              if ((data->lastparams[7] == data->p[7]) &&
                 (!NAN(data->lastparams[7]) && !NAN(data->p[7]))) {
                if (((data->lastparams[8] == data->p[8]) &&
                    (!NAN(data->lastparams[8]) && !NAN(data->p[8]))) &&
                   ((int)data->lastparams[9] == uVar9)) {
                  if ((data->lastparams[10] == data->p[10]) &&
                     (!NAN(data->lastparams[10]) && !NAN(data->p[10]))) {
                    if ((int)uVar9 < 0) goto LAB_0010c996;
                    if (GetIRSample(int)::initialized == '\0') {
                      memset(GetIRSample(int)::samples,0,0x4200);
                      GetIRSample(int)::initialized = '\x01';
                    }
                    if (*(int *)(GetIRSample(int)::samples + (ulong)uVar9 * 0x420 + 0x14) ==
                        globalupdatecount) goto LAB_0010c996;
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  local_98.mutex = (Mutex *)sampleMutex;
  Mutex::Lock((Mutex *)sampleMutex);
  if (0 < data->numchannels) {
    lVar23 = 0;
    do {
      pCVar14 = data->channels + lVar23;
      if (0 < data->numpartitions) {
        lVar29 = 0;
        do {
          if (pCVar14->h[lVar29] != (UnityComplexNumber *)0x0) {
            operator_delete__(pCVar14->h[lVar29]);
          }
          if (pCVar14->x[lVar29] != (UnityComplexNumber *)0x0) {
            operator_delete__(pCVar14->x[lVar29]);
          }
          lVar29 = lVar29 + 1;
        } while (lVar29 < data->numpartitions);
      }
      if (pCVar14->h != (UnityComplexNumber **)0x0) {
        operator_delete__(pCVar14->h);
      }
      if (pCVar14->x != (UnityComplexNumber **)0x0) {
        operator_delete__(pCVar14->x);
      }
      if (pCVar14->s != (float *)0x0) {
        operator_delete__(pCVar14->s);
      }
      if (pCVar14->impulse != (float *)0x0) {
        operator_delete__(pCVar14->impulse);
      }
      lVar23 = lVar23 + 1;
    } while (lVar23 < data->numchannels);
  }
  if (data->channels != (Channel *)0x0) {
    operator_delete__(data->channels);
  }
  if (data->tmpoutput != (UnityComplexNumber *)0x0) {
    operator_delete__(data->tmpoutput);
  }
  uVar3 = *(undefined8 *)data->p;
  uVar4 = *(undefined8 *)(data->p + 2);
  uVar5 = *(undefined8 *)(data->p + 4);
  uVar6 = *(undefined8 *)(data->p + 6);
  uVar7 = *(undefined8 *)(data->p + 9);
  *(undefined8 *)(data->lastparams + 7) = *(undefined8 *)(data->p + 7);
  *(undefined8 *)(data->lastparams + 9) = uVar7;
  *(undefined8 *)(data->lastparams + 4) = uVar5;
  *(undefined8 *)(data->lastparams + 6) = uVar6;
  *(undefined8 *)data->lastparams = uVar3;
  *(undefined8 *)(data->lastparams + 2) = uVar4;
  data->bufferindex = 0;
  data->writeoffset = 0;
  data->numchannels = numchannels;
  data->hopsize = blocksize;
  data->fftsize = blocksize * 2;
  sVar28 = (long)(blocksize * 2) << 3;
  sVar25 = sVar28;
  if (blocksize < 0) {
    sVar25 = 0xffffffffffffffff;
  }
  pUVar13 = (UnityComplexNumber *)operator_new__(sVar25);
  data->tmpoutput = pUVar13;
  uVar26 = (ulong)(uint)numchannels << 5;
  if (numchannels < 0) {
    uVar26 = 0xffffffffffffffff;
  }
  pCVar14 = (Channel *)operator_new__(uVar26);
  data->channels = pCVar14;
  data->samplerate = samplerate;
  memset(pUVar13,0,sVar28);
  fVar38 = (float)samplerate;
  fVar30 = ceilf(data->p[2] * fVar38);
  if ((int)uVar9 < 0) {
LAB_0010c03e:
    iVar18 = (int)fVar30;
  }
  else {
    if (GetIRSample(int)::initialized == '\0') {
      memset(GetIRSample(int)::samples,0,0x4200);
      GetIRSample(int)::initialized = '\x01';
    }
    lVar23 = (ulong)uVar9 * 0x420;
    if (*(int *)(GetIRSample(int)::samples + lVar23 + 8) != 0) {
      fVar30 = ceilf(((float)*(int *)(GetIRSample(int)::samples + lVar23 + 8) * fVar38) /
                     (float)*(int *)(GetIRSample(int)::samples + lVar23 + 0x10));
      goto LAB_0010c03e;
    }
    iVar18 = 0x100;
  }
  iVar20 = data->hopsize;
  iVar10 = 0;
  if (0 < iVar18) {
    iVar10 = iVar18;
  }
  iVar10 = (iVar10 - (uint)(0 < iVar18)) / (iVar20 + (uint)(iVar20 == 0)) + (uint)(0 < iVar18);
  data->numpartitions = iVar10;
  if (0 < data->numchannels) {
    uVar27 = iVar20 * iVar10;
    local_60 = (long)(int)uVar27 * 4;
    if ((int)uVar27 < 0) {
      local_60 = 0xffffffffffffffff;
    }
    lVar29 = (ulong)uVar9 * 0x420;
    local_80 = (double)(int)uVar27;
    local_70 = (long)numchannels;
    uVar26 = (ulong)uVar27;
    lVar23 = (ulong)(uint)numchannels - 1;
    local_48._8_4_ = (int)lVar23;
    local_48._0_8_ = lVar23;
    local_48._12_4_ = (int)((ulong)lVar23 >> 0x20);
    local_88 = (ulong)(numchannels + 3U >> 2) << 4;
    local_78 = (ulong)(uVar27 - 1);
    lVar23 = uVar26 * 4;
    lVar21 = 0;
    local_68 = data;
    do {
      pCVar14 = data->channels + lVar21;
      pfVar15 = (float *)operator_new__(local_60);
      pCVar14->impulse = pfVar15;
      sVar25 = (long)data->fftsize * 4;
      sVar28 = sVar25;
      if ((long)data->fftsize < 0) {
        sVar28 = 0xffffffffffffffff;
      }
      pfVar15 = (float *)operator_new__(sVar28);
      pCVar14->s = pfVar15;
      memset(pfVar15,0,sVar25);
      fVar30 = sinf(data->p[6] * 0.7853982 * (1.0 / fVar38));
      fVar31 = sinf(data->p[7] * 0.7853982 * (1.0 / fVar38));
      local_d8 = local_d8 * 0x19660d + 0x3c6ef35f;
      fVar43 = data->p[8] * -0.89 + 0.9;
      fVar45 = (((float)(local_d8 & 0xffffff ^ local_d8 >> 0x10) * 0.01 * 5.960465e-08 + 0.0) *
                data->p[5] + -1.0) / (data->p[3] * (float)iVar18 * 0.01);
      local_58 = lVar21;
      if ((int)uVar9 < 0) {
        fVar32 = data->p[4];
        if (0 < (int)uVar27) {
          uVar24 = 0;
          do {
            fVar33 = expf((float)(int)uVar24 * fVar45);
            uVar12 = local_d8 * 0x19660d + 0x3c6ef35f;
            fVar34 = powf((float)(uVar12 & 0xffffff ^ uVar12 >> 0x10) * 0.9 * 5.960465e-08 + 0.1,
                          fVar32 * -0.09 + 10.0);
            local_d8 = local_d8 * 0x17385ca9 + 0x47502932;
            pCVar14->impulse[uVar24] =
                 fVar34 * fVar33 *
                 ((float)((local_d8 & 0xffffff ^ local_d8 >> 0x10) * 2) * 5.960465e-08 + -1.0);
            uVar24 = uVar24 + 1;
          } while (uVar26 != uVar24);
          goto LAB_0010c606;
        }
      }
      else {
        if (GetIRSample(int)::initialized == '\0') {
          memset(GetIRSample(int)::samples,0,0x4200);
          GetIRSample(int)::initialized = '\x01';
        }
        auVar8 = _DAT_0011c030;
        if (*(int *)(GetIRSample(int)::samples + lVar29 + 8) == 0) {
          SetupImpulse::dummysample.data = SetupImpulse::dummydata;
          SetupImpulse::dummysample.numsamples = 0x100;
          SetupImpulse::dummysample.numchannels = numchannels;
          SetupImpulse::dummysample.samplerate = samplerate;
          if (0 < numchannels) {
            lVar16 = 0;
            auVar36 = _DAT_0011c050;
            auVar40 = _DAT_0011c3c0;
            do {
              auVar42 = local_48 ^ auVar8;
              auVar44 = auVar36 ^ auVar8;
              iVar20 = auVar42._4_4_;
              if ((bool)(~(iVar20 < auVar44._4_4_ ||
                          auVar42._0_4_ < auVar44._0_4_ && auVar44._4_4_ == iVar20) & 1)) {
                *(undefined4 *)((long)SetupImpulse::dummydata + lVar16) = 0x3f800000;
              }
              if (auVar44._12_4_ <= auVar42._12_4_ &&
                  (auVar44._8_4_ <= auVar42._8_4_ || auVar44._12_4_ != auVar42._12_4_)) {
                *(undefined4 *)((long)SetupImpulse::dummydata + lVar16 + 4) = 0x3f800000;
              }
              iVar10 = SUB164(auVar40 ^ auVar8,4);
              if (iVar10 <= iVar20 &&
                  (iVar10 != iVar20 || SUB164(auVar40 ^ auVar8,0) <= auVar42._0_4_)) {
                *(undefined4 *)((long)SetupImpulse::dummydata + lVar16 + 8) = 0x3f800000;
                *(undefined4 *)((long)SetupImpulse::dummydata + lVar16 + 0xc) = 0x3f800000;
              }
              lVar37 = auVar36._8_8_;
              auVar36._0_8_ = auVar36._0_8_ + 4;
              auVar36._8_8_ = lVar37 + 4;
              lVar37 = auVar40._8_8_;
              auVar40._0_8_ = auVar40._0_8_ + 4;
              auVar40._8_8_ = lVar37 + 4;
              lVar16 = lVar16 + 0x10;
            } while (local_88 != lVar16);
          }
          memcpy(GetIRSample(int)::samples + lVar29,&SetupImpulse::dummysample,0x420);
        }
        iVar20 = numchannels + -1;
        if (lVar21 < local_70) {
          iVar20 = (int)lVar21;
        }
        if (0 < (int)uVar27) {
          iVar10 = *(int *)(GetIRSample(int)::samples + lVar29 + 0x10);
          iVar1 = *(int *)(GetIRSample(int)::samples + lVar29 + 8);
          lVar21 = *(long *)(GetIRSample(int)::samples + lVar29);
          iVar2 = *(int *)(GetIRSample(int)::samples + lVar29 + 0xc);
          local_50 = pCVar14->impulse;
          uVar24 = 0;
          do {
            fVar32 = (float)(int)uVar24 * ((float)iVar10 / fVar38);
            fVar33 = ceilf(fVar32);
            iVar11 = (int)fVar33;
            if (iVar1 <= (int)fVar33) {
              iVar11 = iVar1 + -1;
            }
            iVar19 = iVar11 + 1;
            if (iVar1 <= iVar11 + 1) {
              iVar19 = iVar1 + -1;
            }
            fVar33 = *(float *)(lVar21 + (long)(iVar11 * iVar2 + iVar20) * 4);
            local_50[uVar24] =
                 (*(float *)(lVar21 + (long)(iVar19 * iVar2 + iVar20) * 4) - fVar33) *
                 (fVar32 - (float)iVar11) + fVar33;
            uVar24 = uVar24 + 1;
          } while (uVar26 != uVar24);
        }
        *(int *)(GetIRSample(int)::samples + lVar29 + 0x14) = globalupdatecount;
        data = local_68;
LAB_0010c606:
        fVar43 = fVar43 * fVar43;
        if (0 < (int)uVar27) {
          pfVar15 = pCVar14->impulse;
          fVar32 = 0.0;
          uVar24 = 0;
          fVar33 = 0.0;
          do {
            fVar34 = expf((float)(int)uVar24 * fVar45);
            fVar34 = fVar34 * ((fVar30 + fVar30) - (fVar31 + fVar31)) + fVar31 + fVar31;
            fVar33 = fVar34 * fVar32 + fVar33;
            fVar32 = ((pfVar15[uVar24] - fVar33) - fVar32 * fVar43) * fVar34 + fVar32;
            fVar33 = fVar34 * fVar32 + fVar33;
            fVar32 = fVar32 - (fVar32 * fVar43 + fVar33) * fVar34;
            pfVar15[uVar24] = (1.0 - fVar43 * fVar43) * 0.5 * fVar33;
            uVar24 = uVar24 + 1;
          } while (uVar26 != uVar24);
        }
      }
      if ((0.5 < data->p[10]) && (0 < (int)uVar27 >> 1)) {
        pfVar15 = pCVar14->impulse;
        uVar22 = 0;
        uVar24 = local_78;
        do {
          fVar30 = pfVar15[uVar22];
          iVar20 = (int)uVar24;
          pfVar15[uVar22] = pfVar15[iVar20];
          pfVar15[iVar20] = fVar30;
          uVar22 = uVar22 + 1;
          uVar24 = (ulong)(iVar20 - 1);
        } while ((uint)((int)uVar27 >> 1) != uVar22);
      }
      if (0 < (int)uVar27) {
        fVar30 = 0.0;
        lVar21 = 0;
        do {
          fVar31 = *(float *)((long)pCVar14->impulse + lVar21);
          fVar30 = fVar30 + fVar31 * fVar31;
          lVar21 = lVar21 + 4;
        } while (lVar23 != lVar21);
        if (fVar30 < 0.0) {
          fVar30 = sqrtf(fVar30);
        }
        else {
          fVar30 = SQRT(fVar30);
        }
        if (0 < (int)uVar27) {
          pfVar15 = pCVar14->impulse;
          lVar21 = 0;
          do {
            *(float *)((long)pfVar15 + lVar21) = *(float *)((long)pfVar15 + lVar21) * (1.0 / fVar30)
            ;
            lVar21 = lVar21 + 4;
          } while (lVar23 != lVar21);
        }
      }
      iVar20 = data->numpartitions;
      uVar24 = (long)iVar20 * 8;
      if ((long)iVar20 < 0) {
        uVar24 = 0xffffffffffffffff;
      }
      ppUVar17 = (UnityComplexNumber **)operator_new__(uVar24);
      pCVar14->h = ppUVar17;
      ppUVar17 = (UnityComplexNumber **)operator_new__(uVar24);
      pCVar14->x = ppUVar17;
      if (0 < iVar20) {
        pfVar15 = pCVar14->impulse;
        lVar21 = 0;
        do {
          sVar25 = (long)data->fftsize * 8;
          sVar28 = sVar25;
          if ((long)data->fftsize < 0) {
            sVar28 = 0xffffffffffffffff;
          }
          pUVar13 = (UnityComplexNumber *)operator_new__(sVar28);
          pCVar14->h[lVar21] = pUVar13;
          pUVar13 = (UnityComplexNumber *)operator_new__(sVar28);
          pCVar14->x[lVar21] = pUVar13;
          memset(pCVar14->x[lVar21],0,sVar25);
          memset(pCVar14->h[lVar21],0,(long)data->fftsize << 3);
          iVar20 = data->hopsize;
          pUVar13 = pCVar14->h[lVar21];
          if (0 < (long)iVar20) {
            lVar16 = 0;
            do {
              *(undefined4 *)((long)&pUVar13->re + lVar16 * 2) =
                   *(undefined4 *)((long)pfVar15 + lVar16);
              lVar16 = lVar16 + 4;
            } while ((long)iVar20 * 4 != lVar16);
            pfVar15 = (float *)((long)pfVar15 + lVar16);
          }
          FFT::Forward(pUVar13,data->fftsize,false);
          lVar21 = lVar21 + 1;
        } while (lVar21 < data->numpartitions);
      }
      if (0 < (int)uVar27) {
        pfVar15 = pCVar14->impulse;
        dVar39 = 0.0;
        lVar21 = 0;
        dVar35 = 0.0;
        do {
          dVar41 = (double)ABS(*(float *)((long)pfVar15 + lVar21));
          uVar24 = -(ulong)(dVar39 < dVar41);
          dVar39 = (double)(~uVar24 & (ulong)(dVar39 * 0.9900000095367432 + 9.999999717180685e-10) |
                           (ulong)dVar41 & uVar24);
          dVar35 = dVar35 + dVar39;
          *(float *)((long)pfVar15 + lVar21) = (float)dVar35;
          lVar21 = lVar21 + 4;
        } while (lVar23 != lVar21);
        if (0 < (int)uVar27) {
          pfVar15 = pCVar14->impulse;
          dVar39 = 0.0;
          lVar21 = 0;
          do {
            *(float *)((long)pfVar15 + lVar21) = *(float *)((long)pfVar15 + lVar21) - (float)dVar39;
            dVar39 = dVar39 + dVar35 / local_80;
            lVar21 = lVar21 + 4;
          } while (lVar23 != lVar21);
        }
      }
      lVar21 = local_58 + 1;
    } while (lVar21 < data->numchannels);
  }
  MutexScopeLock::~MutexScopeLock(&local_98);
LAB_0010c996:
  MutexScopeLock::~MutexScopeLock(&local_90);
  return;
}

Assistant:

static void SetupImpulse(EffectData* data, int numchannels, int blocksize, int samplerate)
    {
        MutexScopeLock mutexScope1(*data->mutex);

        Random random;

        int usesample = (int)data->p[P_USESAMPLE];

        // if no parameters have changed, there's no need to recalculate the impulse
        if (data->numchannels == numchannels &&
            data->hopsize == blocksize &&
            data->samplerate == samplerate &&
            data->lastparams[P_TIME] == data->p[P_TIME] &&
            data->lastparams[P_DECAY] == data->p[P_DECAY] &&
            data->lastparams[P_DIFFUSION] == data->p[P_DIFFUSION] &&
            data->lastparams[P_STEREO] == data->p[P_STEREO] &&
            data->lastparams[P_CUTHI] == data->p[P_CUTHI] &&
            data->lastparams[P_CUTLO] == data->p[P_CUTLO] &&
            data->lastparams[P_RESONANCE] == data->p[P_RESONANCE] &&
            (int)data->lastparams[P_USESAMPLE] == usesample &&
            data->lastparams[P_REVERSE] == data->p[P_REVERSE] &&
            (usesample < 0 || GetIRSample(usesample).updatecount == globalupdatecount)
            )
            return;

        MutexScopeLock mutexScope2(sampleMutex);

        // delete old buffers (can be avoided if numchannels, numpartitions and hopsize stay the same)
        for (int i = 0; i < data->numchannels; i++)
        {
            Channel& c = data->channels[i];
            for (int k = 0; k < data->numpartitions; k++)
            {
                delete[] c.h[k];
                delete[] c.x[k];
            }
            delete[] c.h;
            delete[] c.x;
            delete[] c.s;
            delete[] c.impulse;
        }
        delete[] data->channels;
        delete[] data->tmpoutput;

        memcpy(data->lastparams, data->p, sizeof(data->p));

        // reinitialize data
        data->bufferindex = 0;
        data->writeoffset = 0;
        data->numchannels = numchannels;
        data->hopsize = blocksize;
        data->fftsize = blocksize * 2;
        data->tmpoutput = new UnityComplexNumber[data->fftsize];
        data->channels = new Channel[data->numchannels];
        data->samplerate = samplerate;

        memset(data->tmpoutput, 0, sizeof(UnityComplexNumber) * data->fftsize);

        // calculate length of impulse in samples
        int reallength = (int)ceilf(samplerate * data->p[P_TIME]);
        if (usesample >= 0)
        {
            IRSample& s = GetIRSample(usesample);
            if (s.numsamples == 0)
                reallength = 256;
            else
                reallength = (int)ceilf(s.numsamples * (float)samplerate / (float)s.samplerate);
        }

        // calculate length of impulse in samples as a multiple of the number of partitions processed
        data->numpartitions = 0;
        while (data->numpartitions * data->hopsize < reallength)
            data->numpartitions++;
        int impulsesamples = data->numpartitions * data->hopsize;

        // calculate individual impulse responses per channel
        float sampletime = 1.0f / (float)samplerate;
        for (int i = 0; i < data->numchannels; i++)
        {
            Channel& c = data->channels[i];
            c.impulse = new float[impulsesamples];
            c.s = new float[data->fftsize];
            memset(c.s, 0, sizeof(float) * data->fftsize);

            float cuthi = 2.0f * sinf(0.25f * kPI * data->p[P_CUTHI] * sampletime);
            float cutlo = 2.0f * sinf(0.25f * kPI * data->p[P_CUTLO] * sampletime);
            float bw = 0.9f - 0.89f * data->p[P_RESONANCE]; bw *= bw;
            float decayconst = (data->p[P_STEREO] * random.GetFloat(0.0f, 0.01f) - 1.0f) / (reallength * 0.01f * data->p[P_DECAY]);

            if (usesample < 0)
            {
                // calculate the impulse response as decaying white noise
                float d = 10.0f - 0.09f * data->p[P_DIFFUSION];
                for (int n = 0; n < impulsesamples; n++)
                {
                    float env = expf(decayconst * n);
                    c.impulse[n] = env * powf(random.GetFloat(0.1f, 1.0f), d) * random.GetFloat(-1.0f, 1.0f);
                }
            }
            else
            {
                IRSample& s = GetIRSample(usesample);
                if (s.numsamples == 0)
                {
                    static float dummydata[256 * 8];
                    static IRSample dummysample;
                    dummysample.data = dummydata;
                    dummysample.numchannels = numchannels;
                    dummysample.numsamples = 256;
                    dummysample.samplerate = samplerate;
                    for (int n = 0; n < numchannels; n++)
                        dummydata[n] = 1.0f;
                    s = dummysample;
                }

                int channel = (i < numchannels) ? i : (numchannels - 1);
                float speed = (float)s.samplerate / (float)samplerate;
                for (int n = 0; n < impulsesamples; n++)
                {
                    float fpos = n * speed;
                    int ipos1 = (int)ceilf(fpos);
                    if (ipos1 >= s.numsamples)
                        ipos1 = s.numsamples - 1;
                    int ipos2 = ipos1 + 1;
                    if (ipos2 >= s.numsamples)
                        ipos2 = s.numsamples - 1;
                    fpos -= ipos1;
                    float s1 = s.data[ipos1 * s.numchannels + channel];
                    float s2 = s.data[ipos2 * s.numchannels + channel];
                    c.impulse[n] = s1 + (s2 - s1) * fpos;
                }

                s.updatecount = globalupdatecount;
            }

            float lpf = 0.0f, bpf = 0.0f, gain = 0.5f * (1.0f - bw * bw);
            for (int n = 0; n < impulsesamples; n++)
            {
                float env = expf(decayconst * n);
                float cut = cutlo + (cuthi - cutlo) * env;
                lpf += cut * bpf;
                bpf += cut * (c.impulse[n] - lpf - bpf * bw);
                lpf += cut * bpf;
                bpf -= cut * (lpf + bpf * bw);
                c.impulse[n] = gain * lpf;
                //c.impulse[n] = env * sinf(n * 2.0f * 3.1415926f * 1000.0f / 44100.0f); // damped sine -- useful for debugging with click input signals
            }

            if (data->p[P_REVERSE] > 0.5f)
            {
                int len = impulsesamples >> 1;
                for (int n = 0; n < len; n++)
                {
                    float tmp = c.impulse[n];
                    c.impulse[n] = c.impulse[impulsesamples - 1 - n];
                    c.impulse[impulsesamples - 1 - n] = tmp;
                }
            }

            // measure signal power
            float power = 0.0f;
            for (int n = 0; n < impulsesamples; n++)
                power += c.impulse[n] * c.impulse[n];

            // normalize gain
            float scale = 1.0f / sqrtf(power);
            for (int n = 0; n < impulsesamples; n++)
                c.impulse[n] *= scale;

            // partition the impulse response
            c.h = new UnityComplexNumber*[data->numpartitions];
            c.x = new UnityComplexNumber*[data->numpartitions];
            float* src = c.impulse;
            for (int k = 0; k < data->numpartitions; k++)
            {
                c.h[k] = new UnityComplexNumber[data->fftsize];
                c.x[k] = new UnityComplexNumber[data->fftsize];
                memset(c.x[k], 0, sizeof(UnityComplexNumber) * data->fftsize);
                memset(c.h[k], 0, sizeof(UnityComplexNumber) * data->fftsize);
                for (int n = 0; n < data->hopsize; n++)
                    c.h[k][n].re = *src++;
                FFT::Forward(c.h[k], data->fftsize, false);
            }

            // integrate peak detection filtered impulse for later resampling via box-filtering when GUI requests preview waveform
            double sum = 0.0, peak = 0.0;
            for (int n = 0; n < impulsesamples; n++)
            {
                float a = fabsf(c.impulse[n]);
                if (a > peak)
                    peak = a;
                else
                    peak = peak * 0.99f + 1.0e-9f;
                sum += peak;
                c.impulse[n] = (float)sum;
            }
            double dc = -sum / (double)impulsesamples;
            sum = 0.0;
            for (int n = 0; n < impulsesamples; n++)
            {
                c.impulse[n] -= (float)sum;
                sum -= dc;
            }
        }
    }